

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.h
# Opt level: O1

bool __thiscall
CDBIterator::GetKey<(anonymous_namespace)::CoinEntry>(CDBIterator *this,CoinEntry *key)

{
  long in_FS_OFFSET;
  Span<const_std::byte> sp;
  DataStream ssKey;
  DataStream local_40;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_int_&> local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  sp = GetKeyImpl(this);
  DataStream::DataStream(&local_40,sp);
  local_20.m_object = &key->outpoint->n;
  ActionUnserialize::
  SerReadWriteMany<DataStream,unsigned_char&,transaction_identifier<false>&,Wrapper<VarIntFormatter<(VarIntMode)0>,unsigned_int&>>
            (&local_40,&key->key,&key->outpoint->hash,&local_20);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool GetKey(K& key) {
        try {
            DataStream ssKey{GetKeyImpl()};
            ssKey >> key;
        } catch (const std::exception&) {
            return false;
        }
        return true;
    }